

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O1

Extractor * __thiscall ncnn::Extractor::operator=(Extractor *this,Extractor *rhs)

{
  ExtractorPrivate *pEVar1;
  ExtractorPrivate *pEVar2;
  Allocator *pAVar3;
  Allocator *pAVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  bool bVar32;
  int iVar33;
  bool bVar34;
  bool bVar35;
  bool bVar36;
  bool bVar37;
  bool bVar38;
  undefined3 uVar39;
  int iVar40;
  
  if (this != rhs) {
    pEVar1 = rhs->d;
    pEVar2 = this->d;
    pEVar2->net = pEVar1->net;
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator=
              (&pEVar2->blob_mats,&pEVar1->blob_mats);
    pEVar1 = rhs->d;
    pEVar2 = this->d;
    bVar38 = (pEVar1->opt).lightmode;
    uVar39 = *(undefined3 *)&(pEVar1->opt).field_0x1;
    iVar40 = (pEVar1->opt).num_threads;
    pAVar3 = (pEVar1->opt).blob_allocator;
    pAVar4 = (pEVar1->opt).workspace_allocator;
    iVar33 = (pEVar1->opt).openmp_blocktime;
    bVar34 = (pEVar1->opt).use_winograd_convolution;
    bVar35 = (pEVar1->opt).use_sgemm_convolution;
    bVar36 = (pEVar1->opt).use_int8_inference;
    bVar37 = (pEVar1->opt).use_vulkan_compute;
    bVar17 = (pEVar1->opt).use_bf16_storage;
    bVar18 = (pEVar1->opt).use_fp16_packed;
    bVar19 = (pEVar1->opt).use_fp16_storage;
    bVar20 = (pEVar1->opt).use_fp16_arithmetic;
    bVar21 = (pEVar1->opt).use_int8_packed;
    bVar22 = (pEVar1->opt).use_int8_storage;
    bVar23 = (pEVar1->opt).use_int8_arithmetic;
    bVar24 = (pEVar1->opt).use_packing_layout;
    bVar25 = (pEVar1->opt).use_shader_pack8;
    bVar26 = (pEVar1->opt).use_subgroup_basic;
    bVar27 = (pEVar1->opt).use_subgroup_vote;
    bVar28 = (pEVar1->opt).use_subgroup_ballot;
    bVar29 = (pEVar1->opt).use_subgroup_shuffle;
    bVar30 = (pEVar1->opt).use_image_storage;
    bVar31 = (pEVar1->opt).use_tensor_storage;
    bVar32 = (pEVar1->opt).use_reserved_0;
    bVar5 = (pEVar1->opt).use_local_pool_allocator;
    bVar6 = (pEVar1->opt).use_shader_local_memory;
    bVar7 = (pEVar1->opt).use_cooperative_matrix;
    bVar8 = (pEVar1->opt).use_winograd23_convolution;
    bVar9 = (pEVar1->opt).use_winograd43_convolution;
    bVar10 = (pEVar1->opt).use_winograd63_convolution;
    bVar11 = (pEVar1->opt).use_a53_a55_optimized_kernel;
    bVar12 = (pEVar1->opt).use_reserved_7;
    bVar13 = (pEVar1->opt).use_reserved_8;
    bVar14 = (pEVar1->opt).use_reserved_9;
    bVar15 = (pEVar1->opt).use_reserved_10;
    bVar16 = (pEVar1->opt).use_reserved_11;
    (pEVar2->opt).flush_denormals = (pEVar1->opt).flush_denormals;
    (pEVar2->opt).use_local_pool_allocator = bVar5;
    (pEVar2->opt).use_shader_local_memory = bVar6;
    (pEVar2->opt).use_cooperative_matrix = bVar7;
    (pEVar2->opt).use_winograd23_convolution = bVar8;
    (pEVar2->opt).use_winograd43_convolution = bVar9;
    (pEVar2->opt).use_winograd63_convolution = bVar10;
    (pEVar2->opt).use_a53_a55_optimized_kernel = bVar11;
    (pEVar2->opt).use_reserved_7 = bVar12;
    (pEVar2->opt).use_reserved_8 = bVar13;
    (pEVar2->opt).use_reserved_9 = bVar14;
    (pEVar2->opt).use_reserved_10 = bVar15;
    (pEVar2->opt).use_reserved_11 = bVar16;
    (pEVar2->opt).use_bf16_storage = bVar17;
    (pEVar2->opt).use_fp16_packed = bVar18;
    (pEVar2->opt).use_fp16_storage = bVar19;
    (pEVar2->opt).use_fp16_arithmetic = bVar20;
    (pEVar2->opt).use_int8_packed = bVar21;
    (pEVar2->opt).use_int8_storage = bVar22;
    (pEVar2->opt).use_int8_arithmetic = bVar23;
    (pEVar2->opt).use_packing_layout = bVar24;
    (pEVar2->opt).use_shader_pack8 = bVar25;
    (pEVar2->opt).use_subgroup_basic = bVar26;
    (pEVar2->opt).use_subgroup_vote = bVar27;
    (pEVar2->opt).use_subgroup_ballot = bVar28;
    (pEVar2->opt).use_subgroup_shuffle = bVar29;
    (pEVar2->opt).use_image_storage = bVar30;
    (pEVar2->opt).use_tensor_storage = bVar31;
    (pEVar2->opt).use_reserved_0 = bVar32;
    (pEVar2->opt).workspace_allocator = pAVar4;
    (pEVar2->opt).openmp_blocktime = iVar33;
    (pEVar2->opt).use_winograd_convolution = bVar34;
    (pEVar2->opt).use_sgemm_convolution = bVar35;
    (pEVar2->opt).use_int8_inference = bVar36;
    (pEVar2->opt).use_vulkan_compute = bVar37;
    (pEVar2->opt).lightmode = bVar38;
    *(undefined3 *)&(pEVar2->opt).field_0x1 = uVar39;
    (pEVar2->opt).num_threads = iVar40;
    (pEVar2->opt).blob_allocator = pAVar3;
  }
  return this;
}

Assistant:

Extractor& Extractor::operator=(const Extractor& rhs)
{
    if (this == &rhs)
        return *this;

    d->net = rhs.d->net;
    d->blob_mats = rhs.d->blob_mats;
    d->opt = rhs.d->opt;

#if NCNN_VULKAN
    d->local_blob_vkallocator = 0;
    d->local_staging_vkallocator = 0;

    d->blob_mats_gpu = rhs.d->blob_mats_gpu;
    d->blob_mats_gpu_image = rhs.d->blob_mats_gpu_image;
#endif // NCNN_VULKAN

    return *this;
}